

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9MemObjToNumeric(jx9_value *pObj)

{
  sxu32 nLen;
  sxi32 in_EAX;
  sxi32 sVar1;
  jx9_real jVar2;
  char **in_RCX;
  uint uVar3;
  sxu8 bReal;
  sxu8 local_19;
  
  uVar3 = pObj->iFlags;
  if ((uVar3 & 0x2e) != 0) {
    if ((uVar3 & 0x28) == 0) {
      return in_EAX;
    }
    if ((uVar3 & 0x20) != 0) {
      (pObj->x).rVal = 0.0;
    }
    pObj->iFlags = uVar3 & 0xfffffe90 | 2;
    return in_EAX;
  }
  if ((uVar3 & 1) == 0) {
    if ((uVar3 & 0x140) == 0) {
      sVar1 = jx9MemObjToReal(pObj);
      return sVar1;
    }
    sVar1 = jx9MemObjToInteger(pObj);
    return sVar1;
  }
  local_19 = '\0';
  nLen = (pObj->sBlob).nByte;
  if (nLen != 0) {
    sVar1 = SyStrIsNumeric((char *)(pObj->sBlob).pBlob,nLen,&local_19,in_RCX);
    if (local_19 != '\0') {
      sVar1 = jx9MemObjToReal(pObj);
      return sVar1;
    }
    if (sVar1 == 0) {
      jVar2 = (jx9_real)MemObjStringToInt(pObj);
      uVar3 = pObj->iFlags;
      goto LAB_0011cdac;
    }
  }
  jVar2 = 0.0;
LAB_0011cdac:
  (pObj->x).rVal = jVar2;
  pObj->iFlags = uVar3 & 0xfffffe90 | 2;
  sVar1 = SyBlobRelease(&pObj->sBlob);
  return sVar1;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjToNumeric(jx9_value *pObj)
{
	if( pObj->iFlags & (MEMOBJ_INT|MEMOBJ_REAL|MEMOBJ_BOOL|MEMOBJ_NULL) ){
		if( pObj->iFlags & (MEMOBJ_BOOL|MEMOBJ_NULL) ){
			if( pObj->iFlags & MEMOBJ_NULL ){
				pObj->x.iVal = 0;
			}
			MemObjSetType(pObj, MEMOBJ_INT);
		}
		/* Already numeric */
		return  SXRET_OK;
	}
	if( pObj->iFlags & MEMOBJ_STRING ){
		sxi32 rc = SXERR_INVALID;
		sxu8 bReal = FALSE;
		SyString sString;
		SyStringInitFromBuf(&sString, SyBlobData(&pObj->sBlob), SyBlobLength(&pObj->sBlob));
		/* Check if the given string looks like a numeric number */
		if( sString.nByte > 0 ){
			rc = SyStrIsNumeric(sString.zString, sString.nByte, &bReal, 0);
		}
		if( bReal ){
			jx9MemObjToReal(&(*pObj));
		}else{
			if( rc != SXRET_OK ){
				/* The input does not look at all like a number, set the value to 0 */
				pObj->x.iVal = 0;
			}else{
				/* Convert as much as we can */
				pObj->x.iVal = MemObjStringToInt(&(*pObj));
			}
			MemObjSetType(pObj, MEMOBJ_INT);
			SyBlobRelease(&pObj->sBlob);
		}
	}else if(pObj->iFlags & (MEMOBJ_HASHMAP|MEMOBJ_RES)){
		jx9MemObjToInteger(pObj);
	}else{
		/* Perform a blind cast */
		jx9MemObjToReal(&(*pObj));
	}
	return SXRET_OK;
}